

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode rtsp_rtp_readwrite(Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *readmore)

{
  anon_union_240_10_26c073a1_for_proto *paVar1;
  int *piVar2;
  char **ppcVar3;
  Curl_easy *data_00;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  size_t sVar8;
  char *__src;
  CURLcode CVar9;
  curl_write_callback p_Var10;
  char *fmt;
  size_t sVar11;
  size_t __n;
  size_t sVar12;
  CURLcode local_64;
  
  paVar1 = &conn->proto;
  __n = *nread;
  if ((conn->proto).generic == (void *)0x0) {
    __src = (data->req).str;
LAB_001380f9:
    local_64 = CURLE_OUT_OF_MEMORY;
    do {
      if (((long)__n < 1) || (*__src != '$')) goto LAB_00138277;
      if ((long)__n < 5) {
        *readmore = true;
        goto LAB_00138277;
      }
      *(uint *)((long)&conn->proto + 0x10) = (uint)(byte)__src[1];
      sVar12 = (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8) + 4;
      sVar11 = __n - sVar12;
      if ((long)__n < (long)sVar12) {
        *readmore = true;
        iVar5 = 3;
        sVar11 = __n;
      }
      else {
        data_00 = conn->data;
        p_Var10 = (data_00->set).fwrite_rtp;
        lVar7 = 0x6c8;
        if (p_Var10 == (curl_write_callback)0x0) {
          p_Var10 = (data_00->set).fwrite_func;
          lVar7 = 0x6b0;
        }
        pvVar6 = *(void **)((long)&data_00->next + lVar7);
        Curl_set_in_callback(data_00,true);
        sVar8 = (*p_Var10)(__src,1,sVar12,pvVar6);
        Curl_set_in_callback(data_00,false);
        fmt = "Cannot pause RTP";
        if ((sVar8 == 0x10000001) || (fmt = "Failed writing RTP data", sVar8 != sVar12)) {
          bVar4 = false;
          Curl_failf(data_00,fmt);
          CVar9 = CURLE_WRITE_ERROR;
        }
        else {
          CVar9 = CURLE_OK;
          bVar4 = true;
        }
        if (bVar4) {
          __src = __src + sVar12;
          iVar5 = 0;
          if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          }
        }
        else {
          Curl_failf(data,"Got an error writing an RTP packet");
          *readmore = false;
          (*Curl_cfree)((paVar1->ftpc).pp.cache);
          (paVar1->ftpc).pp.cache = (char *)0x0;
          (conn->proto).ftpc.pp.cache_size = 0;
          iVar5 = 1;
          sVar11 = __n;
          local_64 = CVar9;
        }
      }
      __n = sVar11;
    } while (iVar5 == 0);
    if (iVar5 != 3) {
      return local_64;
    }
LAB_00138277:
    if ((__n == 0) || (*__src != '$')) {
      ppcVar3 = &(data->req).str;
      *ppcVar3 = *ppcVar3 + (*nread - __n);
      *nread = __n;
      (*Curl_cfree)((paVar1->ftpc).pp.cache);
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
    }
    else {
      pvVar6 = (*Curl_cmalloc)(__n);
      if (pvVar6 == (void *)0x0) {
        (*Curl_cfree)((paVar1->ftpc).pp.cache);
        (paVar1->ftpc).pp.cache = (char *)0x0;
        (conn->proto).ftpc.pp.cache_size = 0;
        goto LAB_00138319;
      }
      memcpy(pvVar6,__src,__n);
      (*Curl_cfree)((conn->proto).ftpc.pp.cache);
      (conn->proto).generic = pvVar6;
      (conn->proto).rtspc.rtp_bufsize = __n;
      *nread = 0;
    }
    CVar9 = CURLE_OK;
  }
  else {
    pvVar6 = Curl_saferealloc((conn->proto).generic,__n + (conn->proto).ftpc.pp.cache_size);
    if (pvVar6 != (void *)0x0) {
      (conn->proto).generic = pvVar6;
      memcpy((void *)((conn->proto).ftpc.pp.cache_size + (long)pvVar6),(data->req).str,*nread);
      __src = (conn->proto).ftpc.pp.cache;
      __n = (conn->proto).ftpc.pp.cache_size + *nread;
      (conn->proto).rtspc.rtp_bufsize = __n;
      goto LAB_001380f9;
    }
    (paVar1->ftpc).pp.cache = (char *)0x0;
    (conn->proto).ftpc.pp.cache_size = 0;
LAB_00138319:
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  return CVar9;
}

Assistant:

static CURLcode rtsp_rtp_readwrite(struct Curl_easy *data,
                                   struct connectdata *conn,
                                   ssize_t *nread,
                                   bool *readmore) {
  struct SingleRequest *k = &data->req;
  struct rtsp_conn *rtspc = &(conn->proto.rtspc);

  char *rtp; /* moving pointer to rtp data */
  ssize_t rtp_dataleft; /* how much data left to parse in this round */
  char *scratch;
  CURLcode result;

  if(rtspc->rtp_buf) {
    /* There was some leftover data the last time. Merge buffers */
    char *newptr = Curl_saferealloc(rtspc->rtp_buf,
                                    rtspc->rtp_bufsize + *nread);
    if(!newptr) {
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    rtspc->rtp_buf = newptr;
    memcpy(rtspc->rtp_buf + rtspc->rtp_bufsize, k->str, *nread);
    rtspc->rtp_bufsize += *nread;
    rtp = rtspc->rtp_buf;
    rtp_dataleft = rtspc->rtp_bufsize;
  }
  else {
    /* Just parse the request buffer directly */
    rtp = k->str;
    rtp_dataleft = *nread;
  }

  while((rtp_dataleft > 0) &&
        (rtp[0] == '$')) {
    if(rtp_dataleft > 4) {
      int rtp_length;

      /* Parse the header */
      /* The channel identifier immediately follows and is 1 byte */
      rtspc->rtp_channel = RTP_PKT_CHANNEL(rtp);

      /* The length is two bytes */
      rtp_length = RTP_PKT_LENGTH(rtp);

      if(rtp_dataleft < rtp_length + 4) {
        /* Need more - incomplete payload*/
        *readmore = TRUE;
        break;
      }
      /* We have the full RTP interleaved packet
       * Write out the header including the leading '$' */
      DEBUGF(infof(data, "RTP write channel %d rtp_length %d\n",
             rtspc->rtp_channel, rtp_length));
      result = rtp_client_write(conn, &rtp[0], rtp_length + 4);
      if(result) {
        failf(data, "Got an error writing an RTP packet");
        *readmore = FALSE;
        Curl_safefree(rtspc->rtp_buf);
        rtspc->rtp_buf = NULL;
        rtspc->rtp_bufsize = 0;
        return result;
      }

      /* Move forward in the buffer */
      rtp_dataleft -= rtp_length + 4;
      rtp += rtp_length + 4;

      if(data->set.rtspreq == RTSPREQ_RECEIVE) {
        /* If we are in a passive receive, give control back
         * to the app as often as we can.
         */
        k->keepon &= ~KEEP_RECV;
      }
    }
    else {
      /* Need more - incomplete header */
      *readmore = TRUE;
      break;
    }
  }

  if(rtp_dataleft != 0 && rtp[0] == '$') {
    DEBUGF(infof(data, "RTP Rewinding %zd %s\n", rtp_dataleft,
          *readmore ? "(READMORE)" : ""));

    /* Store the incomplete RTP packet for a "rewind" */
    scratch = malloc(rtp_dataleft);
    if(!scratch) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(scratch, rtp, rtp_dataleft);
    Curl_safefree(rtspc->rtp_buf);
    rtspc->rtp_buf = scratch;
    rtspc->rtp_bufsize = rtp_dataleft;

    /* As far as the transfer is concerned, this data is consumed */
    *nread = 0;
    return CURLE_OK;
  }
  /* Fix up k->str to point just after the last RTP packet */
  k->str += *nread - rtp_dataleft;

  /* either all of the data has been read or...
   * rtp now points at the next byte to parse
   */
  if(rtp_dataleft > 0)
    DEBUGASSERT(k->str[0] == rtp[0]);

  DEBUGASSERT(rtp_dataleft <= *nread); /* sanity check */

  *nread = rtp_dataleft;

  /* If we get here, we have finished with the leftover/merge buffer */
  Curl_safefree(rtspc->rtp_buf);
  rtspc->rtp_buf = NULL;
  rtspc->rtp_bufsize = 0;

  return CURLE_OK;
}